

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O3

void av1_fwd_txfm2d_16x8_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 auVar1 [16];
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  int8_t *piVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000009;
  long lVar16;
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  __m256i in [16];
  __m256i out [16];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  
  piVar13 = av1_fwd_txfm_shift_ls[8];
  uVar15 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar12 = false;
  if (uVar15 < 0x10) {
    if ((0x4110U >> (uVar15 & 0x1f) & 1) != 0) {
LAB_00477531:
      lVar16 = 0x100;
      do {
        uVar9 = *(undefined8 *)(input + 4);
        uVar10 = *(undefined8 *)(input + 8);
        uVar11 = *(undefined8 *)(input + 0xc);
        *(undefined8 *)(local_880 + lVar16) = *(undefined8 *)input;
        *(undefined8 *)(local_880 + lVar16 + 8) = uVar9;
        *(undefined8 *)(local_880 + lVar16 + 0x10) = uVar10;
        *(undefined8 *)(local_880 + lVar16 + 0x18) = uVar11;
        input = input + stride;
        lVar16 = lVar16 + -0x20;
      } while (lVar16 != 0);
      goto LAB_00477552;
    }
    if ((0x80a0U >> (uVar15 & 0x1f) & 1) == 0) {
      if (uVar15 == 6) {
        bVar12 = true;
        goto LAB_00477531;
      }
    }
    else {
      bVar12 = true;
    }
  }
  lVar16 = 0;
  do {
    uVar9 = *(undefined8 *)(input + 4);
    uVar10 = *(undefined8 *)(input + 8);
    uVar11 = *(undefined8 *)(input + 0xc);
    *(undefined8 *)(local_860 + lVar16) = *(undefined8 *)input;
    *(undefined8 *)(local_860 + lVar16 + 8) = uVar9;
    *(undefined8 *)(local_860 + lVar16 + 0x10) = uVar10;
    *(undefined8 *)(local_860 + lVar16 + 0x18) = uVar11;
    lVar16 = lVar16 + 0x20;
    input = input + stride;
  } while (lVar16 != 0x100);
LAB_00477552:
  lVar16 = 0;
  if (bVar12) {
    do {
      auVar1 = *(undefined1 (*) [16])(local_860 + lVar16 + 0x10);
      auVar5 = vpshufb_avx(*(undefined1 (*) [16])(local_860 + lVar16),_DAT_005617a0);
      auVar23 = vpmovsxwd_avx2(auVar5);
      *(undefined1 (*) [32])(local_a40 + lVar16 * 2) = auVar23;
      auVar1 = vpshufb_avx(auVar1,_DAT_005617a0);
      auVar23 = vpmovsxwd_avx2(auVar1);
      *(undefined1 (*) [32])(local_a60 + lVar16 * 2) = auVar23;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x100);
  }
  else {
    do {
      auVar23 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_860 + lVar16));
      auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_860 + lVar16 + 0x10));
      *(undefined1 (*) [32])(local_a60 + lVar16 * 2) = auVar23;
      *(undefined1 (*) [32])(local_a40 + lVar16 * 2) = auVar18;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x100);
  }
  pcVar3 = *(code **)((long)col_highbd_txfm8x8_arr + (ulong)(uVar15 * 8));
  bVar2 = *av1_fwd_txfm_shift_ls[8];
  uVar14 = (uint)(char)bVar2;
  if ((int)uVar14 < 0) {
    iVar17 = 1 << (~bVar2 & 0x1f);
    auVar23._4_4_ = iVar17;
    auVar23._0_4_ = iVar17;
    auVar23._8_4_ = iVar17;
    auVar23._12_4_ = iVar17;
    auVar23._16_4_ = iVar17;
    auVar23._20_4_ = iVar17;
    auVar23._24_4_ = iVar17;
    auVar23._28_4_ = iVar17;
    lVar16 = 0;
    do {
      auVar18 = vpaddd_avx2(auVar23,*(undefined1 (*) [32])(local_a60 + lVar16));
      auVar18 = vpsrad_avx2(auVar18,ZEXT416(-uVar14));
      *(undefined1 (*) [32])(local_a60 + lVar16) = auVar18;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x200);
  }
  else if (bVar2 != 0) {
    lVar16 = 0;
    do {
      auVar23 = vpslld_avx2(*(undefined1 (*) [32])(local_a60 + lVar16),ZEXT416(uVar14));
      *(undefined1 (*) [32])(local_a60 + lVar16) = auVar23;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x200);
  }
  pcVar4 = *(code **)((long)row_highbd_txfm8x16_arr + (ulong)(uVar15 * 8));
  (*pcVar3)(local_a60,local_860,0xd,2,2);
  bVar2 = piVar13[1];
  if ((char)bVar2 < '\0') {
    iVar17 = 1 << (~bVar2 & 0x1f);
    auVar18._4_4_ = iVar17;
    auVar18._0_4_ = iVar17;
    auVar18._8_4_ = iVar17;
    auVar18._12_4_ = iVar17;
    auVar18._16_4_ = iVar17;
    auVar18._20_4_ = iVar17;
    auVar18._24_4_ = iVar17;
    auVar18._28_4_ = iVar17;
    lVar16 = 0;
    do {
      auVar23 = vpaddd_avx2(auVar18,*(undefined1 (*) [32])(local_860 + lVar16));
      auVar23 = vpsrad_avx2(auVar23,ZEXT416((uint)-(int)(char)bVar2));
      *(undefined1 (*) [32])(local_860 + lVar16) = auVar23;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x200);
  }
  else if (bVar2 != 0) {
    lVar16 = 0;
    do {
      auVar23 = vpslld_avx2(*(undefined1 (*) [32])(local_860 + lVar16),
                            ZEXT416((uint)(int)(char)bVar2));
      *(undefined1 (*) [32])(local_860 + lVar16) = auVar23;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x200);
  }
  auVar21 = vunpcklps_avx(local_860,local_820);
  auVar20 = vunpckhps_avx(local_860,local_820);
  auVar6 = vunpcklps_avx(local_7e0,local_7a0);
  auVar22 = vunpckhps_avx(local_7e0,local_7a0);
  auVar7 = vunpcklps_avx(local_760,local_720);
  auVar24 = vunpckhps_avx(local_760,local_720);
  auVar8 = vunpcklps_avx(local_6e0,local_6a0);
  auVar19 = vunpckhps_avx(local_6e0,local_6a0);
  auVar23 = vunpcklpd_avx(auVar21,auVar6);
  auVar18 = vunpcklpd_avx(auVar7,auVar8);
  local_a60._16_16_ = auVar18._0_16_;
  local_a60._0_16_ = auVar23._0_16_;
  local_9e0 = vperm2f128_avx(auVar23,auVar18,0x31);
  auVar23 = vunpckhpd_avx(auVar21,auVar6);
  auVar18 = vunpckhpd_avx(auVar7,auVar8);
  local_a40._16_16_ = auVar18._0_16_;
  local_a40._0_16_ = auVar23._0_16_;
  local_9c0 = vperm2f128_avx(auVar23,auVar18,0x31);
  auVar23 = vunpcklpd_avx(auVar20,auVar22);
  auVar18 = vunpcklpd_avx(auVar24,auVar19);
  local_a20._16_16_ = auVar18._0_16_;
  local_a20._0_16_ = auVar23._0_16_;
  local_9a0 = vperm2f128_avx(auVar23,auVar18,0x31);
  auVar23 = vunpckhpd_avx(auVar20,auVar22);
  auVar18 = vunpckhpd_avx(auVar24,auVar19);
  local_a00._16_16_ = auVar18._0_16_;
  local_a00._0_16_ = auVar23._0_16_;
  local_980 = vperm2f128_avx(auVar23,auVar18,0x31);
  auVar24 = vpunpckldq_avx2(local_840,local_800);
  auVar23 = vpunpckhdq_avx2(local_840,local_800);
  auVar19 = vpunpckldq_avx2(local_7c0,local_780);
  auVar18 = vpunpckhdq_avx2(local_7c0,local_780);
  auVar21 = vpunpckldq_avx2(local_740,local_700);
  auVar20 = vpunpckhdq_avx2(local_740,local_700);
  auVar6 = vpunpckldq_avx2(local_6c0,local_680);
  auVar22 = vpunpckhdq_avx2(local_6c0,local_680);
  auVar7 = vpunpcklqdq_avx2(auVar24,auVar19);
  auVar8 = vpunpcklqdq_avx2(auVar21,auVar6);
  local_960._0_16_ = ZEXT116(0) * auVar8._0_16_ + ZEXT116(1) * auVar7._0_16_;
  local_960._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar8._0_16_;
  local_8e0 = vperm2i128_avx2(auVar7,auVar8,0x31);
  auVar24 = vpunpckhqdq_avx2(auVar24,auVar19);
  auVar19 = vpunpckhqdq_avx2(auVar21,auVar6);
  local_940._0_16_ = ZEXT116(0) * auVar19._0_16_ + ZEXT116(1) * auVar24._0_16_;
  local_940._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar19._0_16_;
  local_8c0 = vperm2i128_avx2(auVar24,auVar19,0x31);
  auVar24 = vpunpcklqdq_avx2(auVar23,auVar18);
  auVar19 = vpunpcklqdq_avx2(auVar20,auVar22);
  local_920._0_16_ = ZEXT116(0) * auVar19._0_16_ + ZEXT116(1) * auVar24._0_16_;
  local_920._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar19._0_16_;
  local_8a0 = vperm2i128_avx2(auVar24,auVar19,0x31);
  auVar23 = vpunpckhqdq_avx2(auVar23,auVar18);
  auVar18 = vpunpckhqdq_avx2(auVar20,auVar22);
  local_900._0_16_ = ZEXT116(0) * auVar18._0_16_ + ZEXT116(1) * auVar23._0_16_;
  local_900._16_16_ = ZEXT116(0) * auVar23._16_16_ + ZEXT116(1) * auVar18._0_16_;
  local_880 = vperm2i128_avx2(auVar23,auVar18,0x31);
  (*pcVar4)(local_a60,local_860,0xd,1,1);
  bVar2 = piVar13[2];
  uVar15 = (uint)(char)bVar2;
  if ((int)uVar15 < 0) {
    iVar17 = 1 << (~bVar2 & 0x1f);
    auVar20._4_4_ = iVar17;
    auVar20._0_4_ = iVar17;
    auVar20._8_4_ = iVar17;
    auVar20._12_4_ = iVar17;
    auVar20._16_4_ = iVar17;
    auVar20._20_4_ = iVar17;
    auVar20._24_4_ = iVar17;
    auVar20._28_4_ = iVar17;
    lVar16 = 0;
    auVar22._8_4_ = 0x16a1;
    auVar22._0_8_ = 0x16a1000016a1;
    auVar22._12_4_ = 0x16a1;
    auVar22._16_4_ = 0x16a1;
    auVar22._20_4_ = 0x16a1;
    auVar22._24_4_ = 0x16a1;
    auVar22._28_4_ = 0x16a1;
    auVar24._8_4_ = 0x800;
    auVar24._0_8_ = 0x80000000800;
    auVar24._12_4_ = 0x800;
    auVar24._16_4_ = 0x800;
    auVar24._20_4_ = 0x800;
    auVar24._24_4_ = 0x800;
    auVar24._28_4_ = 0x800;
    do {
      auVar23 = vpaddd_avx2(auVar20,*(undefined1 (*) [32])(local_860 + lVar16));
      auVar23 = vpsrad_avx2(auVar23,ZEXT416(-uVar15));
      auVar23 = vpmulld_avx2(auVar23,auVar22);
      auVar23 = vpaddd_avx2(auVar23,auVar24);
      auVar23 = vpsrad_avx2(auVar23,0xc);
      *(undefined1 (*) [32])(local_860 + lVar16) = auVar23;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x200);
  }
  else {
    lVar16 = 0;
    auVar19._8_4_ = 0x16a1;
    auVar19._0_8_ = 0x16a1000016a1;
    auVar19._12_4_ = 0x16a1;
    auVar19._16_4_ = 0x16a1;
    auVar19._20_4_ = 0x16a1;
    auVar19._24_4_ = 0x16a1;
    auVar19._28_4_ = 0x16a1;
    auVar21._8_4_ = 0x800;
    auVar21._0_8_ = 0x80000000800;
    auVar21._12_4_ = 0x800;
    auVar21._16_4_ = 0x800;
    auVar21._20_4_ = 0x800;
    auVar21._24_4_ = 0x800;
    auVar21._28_4_ = 0x800;
    do {
      auVar23 = vpslld_avx2(*(undefined1 (*) [32])(local_860 + lVar16),ZEXT416(uVar15));
      auVar23 = vpmulld_avx2(auVar23,auVar19);
      auVar23 = vpaddd_avx2(auVar23,auVar21);
      auVar23 = vpsrad_avx2(auVar23,0xc);
      *(undefined1 (*) [32])(local_860 + lVar16) = auVar23;
      lVar16 = lVar16 + 0x20;
    } while (lVar16 != 0x200);
  }
  memcpy(coeff,local_860,0x200);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x8_avx2(const int16_t *input, int32_t *coeff, int stride,
                              TX_TYPE tx_type, int bd) {
  __m256i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const transform_1d_avx2 col_txfm = col_highbd_txfm8x8_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  const int8_t bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_16xn_avx2(input, in, stride, 8, 2, ud_flip, lr_flip);
  round_shift_32_8xn_avx2(in, 16, shift[0], 1);
  col_txfm(in, out, bit, 2, 2);
  round_shift_32_8xn_avx2(out, 16, shift[1], 1);
  fwd_txfm_transpose_8x8_avx2(out, in, 2, 1);
  fwd_txfm_transpose_8x8_avx2(&out[1], &in[8], 2, 1);
  row_txfm(in, out, bit, 1, 1);
  round_shift_rect_array_32_avx2(out, out, 16, -shift[2], NewSqrt2);
  store_buffer_avx2(out, coeff, 8, 16);
  (void)bd;
}